

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O0

void __thiscall
BMRS_XZ<RemSP>::FindRuns
          (BMRS_XZ<RemSP> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  uint64_t *puVar1;
  uchar uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint64_t uVar6;
  uint local_cc;
  uint local_c8;
  ushort local_c2;
  uint label_other_1;
  uint label_other;
  uint label;
  unsigned_short cross_st;
  unsigned_short end_pos;
  unsigned_long uStack_a0;
  unsigned_short start_pos;
  unsigned_long bitpos_1;
  unsigned_long basepos_1;
  uint64_t working_bits_1;
  uint64_t *bit_final_1;
  uint64_t *bits_1;
  uint64_t *bits_f;
  Run *runs_save;
  unsigned_long uStack_60;
  int row;
  unsigned_long bitpos;
  unsigned_long basepos;
  uint64_t working_bits;
  uint64_t *bit_final;
  uint64_t *bits;
  Run *runs_up;
  Run *runs_local;
  int data_width_local;
  int height_local;
  uint64_t *bits_flag_local;
  uint64_t *bits_start_local;
  BMRS_XZ<RemSP> *this_local;
  
  working_bits = (uint64_t)(bits_start + data_width);
  basepos = *bits_start;
  bitpos = 0;
  uStack_60 = 0;
  bit_final = bits_start;
  bits = (uint64_t *)runs;
  runs_up = runs;
  runs_local._0_4_ = data_width;
  runs_local._4_4_ = height;
  _data_width_local = bits_flag;
  bits_flag_local = bits_start;
  bits_start_local = (uint64_t *)this;
  while( true ) {
    while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffffa0,basepos), uVar2 != '\0') {
      runs_up->start_pos = (short)bitpos + (short)uStack_60;
      basepos = (basepos ^ 0xffffffffffffffff) & -1L << ((byte)uStack_60 & 0x3f);
      while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffffa0,basepos), uVar2 == '\0') {
        bit_final = bit_final + 1;
        bitpos = bitpos + 0x40;
        basepos = *bit_final ^ 0xffffffffffffffff;
      }
      basepos = (basepos ^ 0xffffffffffffffff) & -1L << ((byte)uStack_60 & 0x3f);
      runs_up->end_pos = (short)bitpos + (short)uStack_60;
      uVar5 = RemSP::NewLabel();
      runs_up->label = uVar5;
      runs_up = runs_up + 1;
    }
    bit_final = bit_final + 1;
    bitpos = bitpos + 0x40;
    if (bit_final == (uint64_t *)working_bits) break;
    basepos = *bit_final;
  }
  runs_up->start_pos = 0xffff;
  runs_up->end_pos = 0xffff;
  runs_save._4_4_ = 1;
  do {
    runs_up = runs_up + 1;
    if (runs_local._4_4_ <= runs_save._4_4_) {
      uVar5 = RemSP::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
      return;
    }
    bits_f = (uint64_t *)runs_up;
    bits_1 = _data_width_local + (int)runs_local * (runs_save._4_4_ + -1);
    bit_final_1 = bits_flag_local + (int)runs_local * runs_save._4_4_;
    working_bits_1 = (uint64_t)(bit_final_1 + (int)runs_local);
    basepos_1 = *bit_final_1;
    bitpos_1 = 0;
    uStack_a0 = 0;
LAB_002d8bdc:
    while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffff60,basepos_1), uVar2 != '\0') {
      uVar3 = (short)bitpos_1 + (short)uStack_a0;
      basepos_1 = (basepos_1 ^ 0xffffffffffffffff) & -1L << ((byte)uStack_a0 & 0x3f);
      while (uVar2 = YacclabBitScanForward64(&stack0xffffffffffffff60,basepos_1), uVar2 == '\0') {
        bit_final_1 = bit_final_1 + 1;
        bitpos_1 = bitpos_1 + 0x40;
        basepos_1 = *bit_final_1 ^ 0xffffffffffffffff;
      }
      basepos_1 = (basepos_1 ^ 0xffffffffffffffff) & -1L << ((byte)uStack_a0 & 0x3f);
      uVar4 = (short)bitpos_1 + (short)uStack_a0;
      for (; *(ushort *)((long)bits + 2) < uVar3; bits = bits + 1) {
      }
      if (uVar4 < (ushort)*bits) {
        runs_up->start_pos = uVar3;
        runs_up->end_pos = uVar4;
        uVar5 = RemSP::NewLabel();
        runs_up->label = uVar5;
      }
      else {
        local_c2 = uVar3;
        if (uVar3 < (ushort)*bits) {
          local_c2 = (ushort)*bits;
        }
        if (*(ushort *)((long)bits + 2) < uVar4) {
          uVar6 = is_connected(this,bits_1,(uint)local_c2,(uint)*(ushort *)((long)bits + 2));
          if (uVar6 == 0) {
            label_other_1 = 0;
            puVar1 = bits;
          }
          else {
            label_other_1 = RemSP::GetLabel(*(uint *)((long)bits + 4));
            puVar1 = bits;
          }
          while (bits = puVar1 + 1, (ushort)*bits <= uVar4) {
            if (uVar4 <= *(ushort *)((long)puVar1 + 10)) {
              uVar6 = is_connected(this,bits_1,(uint)(ushort)*bits,(uint)uVar4);
              if ((uVar6 != 0) &&
                 (local_c8 = RemSP::GetLabel(*(uint *)((long)bits + 4)), label_other_1 != local_c8))
              {
                if (label_other_1 != 0) {
                  local_c8 = RemSP::Merge(label_other_1,local_c8);
                }
                label_other_1 = local_c8;
              }
              break;
            }
            uVar6 = is_connected(this,bits_1,(uint)(ushort)*bits,
                                 (uint)*(ushort *)((long)puVar1 + 10));
            puVar1 = bits;
            if ((uVar6 != 0) &&
               (local_cc = RemSP::GetLabel(*(uint *)((long)bits + 4)), puVar1 = bits,
               label_other_1 != local_cc)) {
              if (label_other_1 != 0) {
                local_cc = RemSP::Merge(label_other_1,local_cc);
              }
              label_other_1 = local_cc;
              puVar1 = bits;
            }
          }
          if (label_other_1 == 0) {
            uVar5 = RemSP::NewLabel();
            runs_up->label = uVar5;
          }
          else {
            runs_up->label = label_other_1;
          }
          runs_up->start_pos = uVar3;
          runs_up->end_pos = uVar4;
        }
        else {
          uVar6 = is_connected(this,bits_1,(uint)local_c2,(uint)uVar4);
          if (uVar6 == 0) {
            uVar5 = RemSP::NewLabel();
            runs_up->label = uVar5;
          }
          else {
            uVar5 = RemSP::GetLabel(*(uint *)((long)bits + 4));
            runs_up->label = uVar5;
          }
          runs_up->start_pos = uVar3;
          runs_up->end_pos = uVar4;
        }
      }
      runs_up = runs_up + 1;
    }
    bit_final_1 = bit_final_1 + 1;
    bitpos_1 = bitpos_1 + 0x40;
    if (bit_final_1 != (uint64_t *)working_bits_1) {
      basepos_1 = *bit_final_1;
      goto LAB_002d8bdc;
    }
    runs_up->start_pos = 0xffff;
    runs_up->end_pos = 0xffff;
    bits = bits_f;
    runs_save._4_4_ = runs_save._4_4_ + 1;
  } while( true );
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }